

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.cpp
# Opt level: O3

void loguru::suggest_log_path(char *prefix,char *buff,uint buff_size)

{
  char *pcVar1;
  size_t sVar2;
  ulong uVar3;
  
  if (*prefix == '~') {
    pcVar1 = home_dir();
    snprintf(buff,(ulong)(buff_size - 1),"%s%s",pcVar1,prefix + 1);
  }
  else {
    snprintf(buff,(ulong)(buff_size - 1),"%s",prefix);
  }
  sVar2 = strlen(buff);
  uVar3 = (ulong)buff_size;
  if ((sVar2 != 0) && (buff[sVar2 - 1] != '/')) {
    if (uVar3 <= sVar2 + 2) {
      suggest_log_path();
    }
    (buff + sVar2)[0] = '/';
    (buff + sVar2)[1] = '\0';
  }
  pcVar1 = s_argv0_filename_abi_cxx11_;
  sVar2 = strlen(buff);
  strncat(buff,pcVar1,~sVar2 + uVar3);
  sVar2 = strlen(buff);
  strncat(buff,"/",~sVar2 + uVar3);
  sVar2 = strlen(buff);
  write_date_time(buff + sVar2,uVar3 - sVar2);
  sVar2 = strlen(buff);
  strncat(buff,".log",uVar3 + ~sVar2);
  return;
}

Assistant:

void suggest_log_path(const char* prefix, char* buff, unsigned buff_size)
	{
		if (prefix[0] == '~') {
			snprintf(buff, buff_size - 1, "%s%s", home_dir(), prefix + 1);
		} else {
			snprintf(buff, buff_size - 1, "%s", prefix);
		}

		// Check for terminating /
		size_t n = strlen(buff);
		if (n != 0) {
			if (buff[n - 1] != '/') {
				CHECK_F(n + 2 < buff_size, "Filename buffer too small");
				buff[n] = '/';
				buff[n + 1] = '\0';
			}
		}

		strncat(buff, s_argv0_filename.c_str(), buff_size - strlen(buff) - 1);
		strncat(buff, "/",                      buff_size - strlen(buff) - 1);
		write_date_time(buff + strlen(buff),    buff_size - strlen(buff));
		strncat(buff, ".log",                   buff_size - strlen(buff) - 1);
	}